

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall testing::internal::MatchMatrix::NextGraph(MatchMatrix *this)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = this->num_elements_;
  if (uVar4 != 0) {
    uVar3 = this->num_matchers_;
    uVar2 = 0;
    do {
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        uVar4 = 0;
        do {
          pcVar1 = (this->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bVar5 = pcVar1[uVar4 + uVar3 * uVar2] == '\0';
          pcVar1[uVar4 + uVar3 * uVar2] = bVar5;
          if (bVar5) {
            return true;
          }
          uVar4 = uVar4 + 1;
          uVar3 = this->num_matchers_;
        } while (uVar4 < uVar3);
        uVar4 = this->num_elements_;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar4);
  }
  return false;
}

Assistant:

size_t RhsSize() const { return num_matchers_; }